

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenBoundingBoxesProcess.cpp
# Opt level: O1

void Assimp::checkMesh(aiMesh *mesh,aiVector3D *min,aiVector3D *max)

{
  float fVar1;
  aiVector3D *paVar2;
  long lVar3;
  ulong uVar4;
  
  if (mesh != (aiMesh *)0x0) {
    if ((mesh->mNumVertices != 0) && (mesh->mNumVertices != 0)) {
      lVar3 = 8;
      uVar4 = 0;
      do {
        paVar2 = mesh->mVertices;
        fVar1 = *(float *)((long)paVar2 + lVar3 + -8);
        if (fVar1 < min->x) {
          min->x = fVar1;
        }
        fVar1 = *(float *)((long)paVar2 + lVar3 + -4);
        if (fVar1 < min->y) {
          min->y = fVar1;
        }
        fVar1 = *(float *)((long)&paVar2->x + lVar3);
        if (fVar1 < min->z) {
          min->z = fVar1;
        }
        fVar1 = *(float *)((long)paVar2 + lVar3 + -8);
        if (max->x <= fVar1 && fVar1 != max->x) {
          max->x = fVar1;
        }
        fVar1 = *(float *)((long)paVar2 + lVar3 + -4);
        if (max->y <= fVar1 && fVar1 != max->y) {
          max->y = fVar1;
        }
        fVar1 = *(float *)((long)&paVar2->x + lVar3);
        if (max->z <= fVar1 && fVar1 != max->z) {
          max->z = fVar1;
        }
        uVar4 = uVar4 + 1;
        lVar3 = lVar3 + 0xc;
      } while (uVar4 < mesh->mNumVertices);
    }
    return;
  }
  __assert_fail("nullptr != mesh",
                "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/PostProcessing/GenBoundingBoxesProcess.cpp"
                ,0x41,"void Assimp::checkMesh(aiMesh *, aiVector3D &, aiVector3D &)");
}

Assistant:

void checkMesh(aiMesh* mesh, aiVector3D& min, aiVector3D& max) {
    ai_assert(nullptr != mesh);

    if (0 == mesh->mNumVertices) {
        return;
    }

    for (unsigned int i = 0; i < mesh->mNumVertices; ++i) {
        const aiVector3D &pos = mesh->mVertices[i];
        if (pos.x < min.x) {
            min.x = pos.x;
        }
        if (pos.y < min.y) {
            min.y = pos.y;
        }
        if (pos.z < min.z) {
            min.z = pos.z;
        }

        if (pos.x > max.x) {
            max.x = pos.x;
        }
        if (pos.y > max.y) {
            max.y = pos.y;
        }
        if (pos.z > max.z) {
            max.z = pos.z;
        }
    }
}